

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a92a0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a92a7._0_1_ = '-';
    uRam00000000001a92a7._1_1_ = '-';
    uRam00000000001a92a7._2_1_ = '-';
    uRam00000000001a92a7._3_1_ = '-';
    uRam00000000001a92a7._4_1_ = '-';
    uRam00000000001a92a7._5_1_ = '-';
    uRam00000000001a92a7._6_1_ = '-';
    uRam00000000001a92a7._7_1_ = '-';
    DAT_001a9290 = '-';
    DAT_001a9290_1._0_1_ = '-';
    DAT_001a9290_1._1_1_ = '-';
    DAT_001a9290_1._2_1_ = '-';
    DAT_001a9290_1._3_1_ = '-';
    DAT_001a9290_1._4_1_ = '-';
    DAT_001a9290_1._5_1_ = '-';
    DAT_001a9290_1._6_1_ = '-';
    uRam00000000001a9298 = 0x2d2d2d2d2d2d2d;
    DAT_001a929f = 0x2d;
    DAT_001a9280 = '-';
    DAT_001a9280_1._0_1_ = '-';
    DAT_001a9280_1._1_1_ = '-';
    DAT_001a9280_1._2_1_ = '-';
    DAT_001a9280_1._3_1_ = '-';
    DAT_001a9280_1._4_1_ = '-';
    DAT_001a9280_1._5_1_ = '-';
    DAT_001a9280_1._6_1_ = '-';
    uRam00000000001a9288._0_1_ = '-';
    uRam00000000001a9288._1_1_ = '-';
    uRam00000000001a9288._2_1_ = '-';
    uRam00000000001a9288._3_1_ = '-';
    uRam00000000001a9288._4_1_ = '-';
    uRam00000000001a9288._5_1_ = '-';
    uRam00000000001a9288._6_1_ = '-';
    uRam00000000001a9288._7_1_ = '-';
    DAT_001a9270 = '-';
    DAT_001a9270_1._0_1_ = '-';
    DAT_001a9270_1._1_1_ = '-';
    DAT_001a9270_1._2_1_ = '-';
    DAT_001a9270_1._3_1_ = '-';
    DAT_001a9270_1._4_1_ = '-';
    DAT_001a9270_1._5_1_ = '-';
    DAT_001a9270_1._6_1_ = '-';
    uRam00000000001a9278._0_1_ = '-';
    uRam00000000001a9278._1_1_ = '-';
    uRam00000000001a9278._2_1_ = '-';
    uRam00000000001a9278._3_1_ = '-';
    uRam00000000001a9278._4_1_ = '-';
    uRam00000000001a9278._5_1_ = '-';
    uRam00000000001a9278._6_1_ = '-';
    uRam00000000001a9278._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a9268._0_1_ = '-';
    uRam00000000001a9268._1_1_ = '-';
    uRam00000000001a9268._2_1_ = '-';
    uRam00000000001a9268._3_1_ = '-';
    uRam00000000001a9268._4_1_ = '-';
    uRam00000000001a9268._5_1_ = '-';
    uRam00000000001a9268._6_1_ = '-';
    uRam00000000001a9268._7_1_ = '-';
    DAT_001a92af = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}